

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O0

void __thiscall cali::Caliper::activate_channel(Caliper *this,Channel *channel)

{
  GlobalData *pGVar1;
  bool bVar2;
  element_type *peVar3;
  unsigned_long *puVar4;
  size_type local_40;
  __normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
  local_38;
  Channel *local_30;
  __normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
  local_28;
  __normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
  local_20;
  __normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_> it
  ;
  Channel *channel_local;
  Caliper *this_local;
  
  it._M_current = channel;
  peVar3 = std::__shared_ptr_access<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)channel);
  peVar3->is_active = true;
  local_28._M_current =
       (Channel *)
       std::vector<cali::Channel,_std::allocator<cali::Channel>_>::begin(&this->sG->active_channels)
  ;
  local_30 = (Channel *)
             std::vector<cali::Channel,_std::allocator<cali::Channel>_>::end
                       (&this->sG->active_channels);
  local_20 = std::
             find<__gnu_cxx::__normal_iterator<cali::Channel*,std::vector<cali::Channel,std::allocator<cali::Channel>>>,cali::Channel>
                       (local_28,(__normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
                                  )local_30,it._M_current);
  local_38._M_current =
       (Channel *)
       std::vector<cali::Channel,_std::allocator<cali::Channel>_>::end(&this->sG->active_channels);
  bVar2 = __gnu_cxx::operator==(&local_20,&local_38);
  if (bVar2) {
    std::vector<cali::Channel,std::allocator<cali::Channel>>::emplace_back<cali::Channel&>
              ((vector<cali::Channel,std::allocator<cali::Channel>> *)&this->sG->active_channels,
               it._M_current);
  }
  pGVar1 = this->sG;
  local_40 = std::vector<cali::Channel,_std::allocator<cali::Channel>_>::size
                       (&this->sG->active_channels);
  puVar4 = std::max<unsigned_long>(&pGVar1->max_active_channels,&local_40);
  this->sG->max_active_channels = *puVar4;
  return;
}

Assistant:

void Caliper::activate_channel(Channel& channel)
{
    channel.mP->is_active = true;

    auto it = std::find(sG->active_channels.begin(), sG->active_channels.end(), channel);
    if (it == sG->active_channels.end())
        sG->active_channels.emplace_back(channel);

    sG->max_active_channels = std::max(sG->max_active_channels, sG->active_channels.size());
}